

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O2

unsigned_long __thiscall internalJSONNode::operator_cast_to_unsigned_long(internalJSONNode *this)

{
  byte bVar1;
  unsigned_long uVar2;
  ulong uVar3;
  
  Fetch(this);
  bVar1 = this->_type;
  uVar2 = (unsigned_long)bVar1;
  if (bVar1 != 0) {
    if (bVar1 == 1) {
      FetchNumber(this);
    }
    else if (bVar1 == 3) {
      return (ulong)(this->_value)._bool;
    }
    uVar3 = (ulong)(this->_value)._number;
    uVar2 = (long)((this->_value)._number - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
  }
  return uVar2;
}

Assistant:

internalJSONNode::operator unsigned long long() const json_nothrow
    #endif /*<- */
    {
	   Fetch();
	   #ifdef JSON_CASTABLE /*-> JSON_CASTABLE */
		  switch(type()){
			 case JSON_NULL:
				return 0;
			 case JSON_BOOL:
				return _value._bool ? 1 : 0;
			 case JSON_STRING:
				FetchNumber();
		  }
	   #endif /*<- */
	   #ifdef JSON_ISO_STRICT /*-> JSON_ISO_STRICT */
		  JSON_ASSERT(type() == JSON_NUMBER, json_global(ERROR_UNDEFINED) + JSON_TEXT("(unsigned long)"));
		  JSON_ASSERT(_value._number > 0, _string + json_global(ERROR_LOWER_RANGE) + JSON_TEXT("unsigned long"));
		  JSON_ASSERT(_value._number < ULONG_MAX, _string + json_global(ERROR_UPPER_RANGE) + JSON_TEXT("unsigned long"));
		  JSON_ASSERT(_value._number == (json_number)((unsigned long)_value._number), json_string(JSON_TEXT("(unsigend long) will truncate ")) + _string);
		  return (unsigned long)_value._number;
	   #else /*<- else */
		  JSON_ASSERT(type() == JSON_NUMBER, json_global(ERROR_UNDEFINED) + JSON_TEXT("(unsigned long long)"));
		  JSON_ASSERT(_value._number > 0, _string + json_global(ERROR_LOWER_RANGE) + JSON_TEXT("unsigned long long"));
		  #ifdef ULONG_LONG_MAX
			 JSON_ASSERT(_value._number < ULONG_LONG_MAX, _string + json_global(ERROR_UPPER_RANGE) + JSON_TEXT("unsigned long long"));
		  #elif defined(ULLONG_MAX)
			 JSON_ASSERT(_value._number < ULLONG_MAX, _string + json_global(ERROR_UPPER_RANGE) + JSON_TEXT("unsigned long long"));
		  #endif
		  JSON_ASSERT(_value._number == (json_number)((unsigned long long)_value._number), json_string(JSON_TEXT("(unsigned long long) will truncate ")) + _string);
		  return (unsigned long long)_value._number;
	   #endif /*<- */
    }